

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O0

CrispyValue std_input(CrispyValue *value,Vm *vm)

{
  ssize_t sVar1;
  ObjString *pOVar2;
  CrispyValue CVar3;
  ObjString *string;
  ssize_t length;
  char *line;
  Vm *vm_local;
  CrispyValue *value_local;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 local_10;
  
  line = (char *)vm;
  vm_local = (Vm *)value;
  sVar1 = read_line((char **)&length);
  if (sVar1 < 0) {
    line[0x2101] = '\x01';
    pOVar2 = new_string((Vm *)line,"Error while reading line from stdin",0x23);
    CVar3 = create_object(&pOVar2->object);
    local_10 = CVar3.field_1;
    value_local._0_4_ = CVar3.type;
  }
  else {
    pOVar2 = new_string((Vm *)line,(char *)length,sVar1 - 1);
    free((void *)length);
    CVar3 = create_object(&pOVar2->object);
    local_10 = CVar3.field_1;
    value_local._0_4_ = CVar3.type;
  }
  CVar3._4_4_ = 0;
  CVar3.type = (ValueType)value_local;
  CVar3.field_1.p_value = local_10.p_value;
  return CVar3;
}

Assistant:

CrispyValue std_input(CrispyValue *value, Vm *vm) {
    char *line;
    ssize_t length = read_line(&line);

    if (length < 0) {
        vm->err_flag = true;
        return create_object((Object *) new_string(vm, "Error while reading line from stdin", 35));
    }

    // cut off trailing newline
    ObjString *string = new_string(vm, line, (size_t) length - 1);
    free(line);

    return create_object((Object *) string);
}